

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O2

string * __thiscall
nlohmann::json_uri::to_string_abi_cxx11_(string *__return_storage_ptr__,json_uri *this)

{
  bool bVar1;
  ostream *poVar2;
  stringstream s;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  location_abi_cxx11_(&sStack_1c8,this);
  poVar2 = std::operator<<(local_198,(string *)&sStack_1c8);
  std::operator<<(poVar2," # ");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  bVar1 = std::operator==(&this->identifier_,"");
  if (bVar1) {
    json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    to_string(&sStack_1c8,&this->pointer_);
    std::operator<<(local_198,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
  }
  else {
    std::operator<<(local_198,(string *)&this->identifier_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string json_uri::to_string() const
{
	std::stringstream s;

	s << location() << " # ";

	if (identifier_ == "")
		s << pointer_.to_string();
	else
		s << identifier_;

	return s.str();
}